

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::SpawnHealth(AActor *this)

{
  uint uVar1;
  AActor *pAVar2;
  double dVar3;
  double dVar4;
  int local_5c;
  int local_4c;
  bool local_3d;
  int local_3c;
  int adj_1;
  int adj;
  int local_1c;
  AActor *pAStack_18;
  int defhealth;
  AActor *this_local;
  
  pAStack_18 = this;
  if (this->StartHealth == 0) {
    pAVar2 = GetDefault(this);
    local_3c = pAVar2->health;
  }
  else {
    local_3c = this->StartHealth;
  }
  local_1c = local_3c;
  TFlags<ActorFlag3,_unsigned_int>::operator&
            ((TFlags<ActorFlag3,_unsigned_int> *)&adj,
             (int)this + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&adj);
  local_3d = uVar1 == 0 || local_1c == 0;
  if (local_3d) {
    this_local._4_4_ = local_1c;
  }
  else {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)&adj_1,
               (int)this +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&adj_1);
    if (uVar1 == 0) {
      dVar3 = (double)local_1c;
      dVar4 = G_SkillProperty(SKILLP_MonsterHealth);
      local_5c = (int)(dVar3 * dVar4);
      if (local_5c < 1) {
        local_5c = 1;
      }
      this_local._4_4_ = local_5c;
    }
    else {
      dVar3 = (double)local_1c;
      dVar4 = G_SkillProperty(SKILLP_FriendlyHealth);
      local_4c = (int)(dVar3 * dVar4);
      if (local_4c < 1) {
        local_4c = 1;
      }
      this_local._4_4_ = local_4c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int AActor::SpawnHealth() const
{
	int defhealth = StartHealth ? StartHealth : GetDefault()->health;
	if (!(flags3 & MF3_ISMONSTER) || defhealth == 0)
	{
		return defhealth;
	}
	else if (flags & MF_FRIENDLY)
	{
		int adj = int(defhealth * G_SkillProperty(SKILLP_FriendlyHealth));
		return (adj <= 0) ? 1 : adj;
	}
	else
	{
		int adj = int(defhealth * G_SkillProperty(SKILLP_MonsterHealth));
		return (adj <= 0) ? 1 : adj;
	}
}